

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.cpp
# Opt level: O2

int __thiscall ncnn::Squeeze::forward(Squeeze *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int _h;
  int _h_00;
  uint uVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  ulong uVar12;
  int iVar13;
  bool bVar14;
  bool bVar15;
  Mat local_80;
  Option *local_38;
  
  uVar1 = bottom_blob->dims;
  iVar8 = bottom_blob->w;
  _h = bottom_blob->h;
  _h_00 = bottom_blob->c;
  pvVar3 = (this->axes).data;
  if ((pvVar3 == (void *)0x0) || ((long)(this->axes).c * (this->axes).cstep == 0)) {
    bVar14 = this->squeeze_w != 0 && iVar8 == 1;
    bVar11 = this->squeeze_h != 0 && _h == 1;
    bVar10 = this->squeeze_c != 0 && _h_00 == 1;
  }
  else {
    uVar2 = (this->axes).w;
    bVar15 = iVar8 == 1;
    uVar12 = 0;
    uVar9 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar9 = uVar12;
    }
    bVar14 = false;
    bVar11 = false;
    bVar10 = false;
    for (; local_38 = opt, uVar9 != uVar12; uVar12 = uVar12 + 1) {
      iVar13 = *(int *)((long)pvVar3 + uVar12 * 4);
      iVar13 = (iVar13 >> 0x1f & uVar1) + iVar13;
      bVar4 = bVar14;
      bVar6 = bVar11;
      bVar7 = bVar10;
      if (iVar13 == 0) {
        bVar4 = bVar15;
        bVar6 = _h == 1;
        bVar7 = _h_00 == 1;
      }
      if (uVar1 != 2) {
        bVar6 = bVar11;
      }
      if (uVar1 != 1) {
        bVar4 = bVar14;
      }
      bVar5 = bVar4;
      bVar11 = bVar6;
      if (iVar13 == 1) {
        bVar5 = bVar15;
        bVar11 = _h == 1;
      }
      if (uVar1 != 2) {
        bVar5 = bVar4;
      }
      bVar14 = bVar5;
      if (iVar13 == 2) {
        bVar14 = bVar15;
      }
      if (uVar1 != 3) {
        bVar14 = bVar5;
        bVar11 = bVar6;
        bVar7 = bVar10;
      }
      bVar10 = bVar7;
    }
  }
  ncnn::Mat::operator=(top_blob,bottom_blob);
  if (uVar1 == 3) {
    if (bVar14) {
      if (bVar11) {
        if (bVar10) {
          ncnn::Mat::reshape(&local_80,bottom_blob,1,opt->blob_allocator);
          ncnn::Mat::operator=(top_blob,&local_80);
        }
        else {
          ncnn::Mat::reshape(&local_80,bottom_blob,_h_00,opt->blob_allocator);
          ncnn::Mat::operator=(top_blob,&local_80);
        }
      }
      else if (bVar10) {
        ncnn::Mat::reshape(&local_80,bottom_blob,_h,opt->blob_allocator);
        ncnn::Mat::operator=(top_blob,&local_80);
      }
      else {
        ncnn::Mat::reshape(&local_80,bottom_blob,_h,_h_00,opt->blob_allocator);
        ncnn::Mat::operator=(top_blob,&local_80);
      }
    }
    else if (bVar11) {
      if (bVar10) {
        ncnn::Mat::reshape(&local_80,bottom_blob,iVar8,opt->blob_allocator);
        ncnn::Mat::operator=(top_blob,&local_80);
      }
      else {
        ncnn::Mat::reshape(&local_80,bottom_blob,iVar8,_h_00,opt->blob_allocator);
        ncnn::Mat::operator=(top_blob,&local_80);
      }
    }
    else {
      if (!bVar10) goto LAB_0026cb4d;
      ncnn::Mat::reshape(&local_80,bottom_blob,iVar8,_h,opt->blob_allocator);
      ncnn::Mat::operator=(top_blob,&local_80);
    }
  }
  else if (uVar1 == 2) {
    if (bVar14) {
      if (bVar11) {
        ncnn::Mat::reshape(&local_80,bottom_blob,1,opt->blob_allocator);
        ncnn::Mat::operator=(top_blob,&local_80);
      }
      else {
        ncnn::Mat::reshape(&local_80,bottom_blob,_h,opt->blob_allocator);
        ncnn::Mat::operator=(top_blob,&local_80);
      }
    }
    else {
      if (!bVar11) goto LAB_0026cb4d;
      ncnn::Mat::reshape(&local_80,bottom_blob,iVar8,opt->blob_allocator);
      ncnn::Mat::operator=(top_blob,&local_80);
    }
  }
  else {
    if ((uVar1 != 1) || (!bVar14)) goto LAB_0026cb4d;
    ncnn::Mat::reshape(&local_80,bottom_blob,1,opt->blob_allocator);
    ncnn::Mat::operator=(top_blob,&local_80);
  }
  ncnn::Mat::~Mat(&local_80);
LAB_0026cb4d:
  if ((top_blob->data == (void *)0x0) || (iVar8 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
    iVar8 = -100;
  }
  return iVar8;
}

Assistant:

int Squeeze::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool _squeeze_w = false;
    bool _squeeze_h = false;
    bool _squeeze_c = false;

    if (axes.empty())
    {
        _squeeze_w = w == 1 && squeeze_w;
        _squeeze_h = h == 1 && squeeze_h;
        _squeeze_c = channels == 1 && squeeze_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i = 0; i < axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + axis;

            if (dims == 1 && axis == 0)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 2 && axis == 0)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 2 && axis == 1)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 3 && axis == 0)
            {
                _squeeze_c = channels == 1;
            }
            if (dims == 3 && axis == 1)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 3 && axis == 2)
            {
                _squeeze_w = w == 1;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
    }

    if (dims == 3)
    {
        if (_squeeze_w && _squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, channels, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, channels, opt.blob_allocator);
        }
        else if (_squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, h, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}